

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QStyle * __thiscall QStyleSheetStyle::baseStyle(QStyleSheetStyle *this)

{
  QStyle *pQVar1;
  long lVar2;
  
  pQVar1 = *(QStyle **)(this + 0x10);
  if (pQVar1 == (QStyle *)0x0) {
    QApplication::style();
    lVar2 = QMetaObject::cast((QObject *)&staticMetaObject);
    if (lVar2 == 0) {
      pQVar1 = QApplication::style();
      return pQVar1;
    }
    pQVar1 = *(QStyle **)(lVar2 + 0x10);
  }
  return pQVar1;
}

Assistant:

QStyle *QStyleSheetStyle::baseStyle() const
{
    if (base)
        return base;
    if (QStyleSheetStyle *me = qt_styleSheet(QApplication::style()))
        return me->base;
    return QApplication::style();
}